

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphIterator.cpp
# Opt level: O1

bool __thiscall GlyphIterator::next(GlyphIterator *this)

{
  uint uVar1;
  
  uVar1 = this->pixel + 1;
  this->pixel = uVar1;
  if (uVar1 < this->length) {
    this->xOffset = this->xOffset + 1;
    if (uVar1 % (uint)this->width == 0) {
      this->xOffset = (int)this->glyph->xOffset;
      this->yOffset = this->yOffset + 1;
    }
    this->value = (this->font->bitmap[(ulong)(uVar1 >> 3) + (ulong)this->glyph->bitmapOffset] &
                  (byte)(0x80 >> ((byte)uVar1 & 7))) != 0;
  }
  return uVar1 < this->length;
}

Assistant:

bool GlyphIterator::next()
{
   this->pixel++;
   if (this->pixel >= this->length)
   {
      return 0; //end of glyph
   }

   //increment offsets
   this->xOffset++;
   if ((this->pixel % this->width) == 0) //wrap around?
   {
      this->xOffset = this->glyph->xOffset;
      this->yOffset++;
   }

   //get new pixel value
   this->value = getPixelValue(this->pixel);
   return 1;
}